

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

object * __thiscall pybind11::object::operator=(object *this,object *other)

{
  handle *in_RSI;
  handle *in_RDI;
  handle temp;
  handle local_18;
  handle *local_10;
  
  if (in_RDI != in_RSI) {
    local_10 = in_RSI;
    pybind11::handle::handle<_object_*,_0>(&local_18,((handle *)&in_RDI->m_ptr)->m_ptr);
    in_RDI->m_ptr = ((handle *)&local_10->m_ptr)->m_ptr;
    ((handle *)&local_10->m_ptr)->m_ptr = (PyObject *)0x0;
    pybind11::handle::dec_ref(in_RDI);
  }
  return (object *)in_RDI;
}

Assistant:

object &operator=(object &&other) noexcept {
        if (this != &other) {
            handle temp(m_ptr);
            m_ptr = other.m_ptr;
            other.m_ptr = nullptr;
            temp.dec_ref();
        }
        return *this;
    }